

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit<ritobin::Vec4>
          (BinBinaryReader *this,Vec4 *value)

{
  char *pcVar1;
  char **ppcVar2;
  char *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  char *pcVar6;
  
  pcVar6 = (this->reader).cur_;
  pcVar3 = (this->reader).cap_;
  pcVar1 = pcVar6 + 0x10;
  if (pcVar3 < pcVar1) {
    bVar5 = fail_msg(this,"reader.read(value.value)",(this->reader).cur_);
    pcVar6 = (char *)(ulong)bVar5;
  }
  else {
    uVar4 = *(undefined8 *)(pcVar6 + 8);
    *(undefined8 *)(value->value)._M_elems = *(undefined8 *)pcVar6;
    *(undefined8 *)((value->value)._M_elems + 2) = uVar4;
    ppcVar2 = &(this->reader).cur_;
    *ppcVar2 = *ppcVar2 + 0x10;
  }
  return (bool)(pcVar1 <= pcVar3 | (byte)pcVar6 & 1);
}

Assistant:

bool read(std::array<T, SIZE>& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) * SIZE > cap_) {
                return false;
            }
            memcpy(value.data(), cur_, sizeof(T) * SIZE);
            cur_ += sizeof(T) * SIZE;
            return true;
        }